

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall MemoryBufferTest_Grow_Test::TestBody(MemoryBufferTest_Grow_Test *this)

{
  FunctionMocker<void_(int_*,_unsigned_long)> *this_00;
  int iVar1;
  bool bVar2;
  long lVar3;
  MockSpec<int_*(unsigned_long)> *this_01;
  TypedExpectation<int_*(unsigned_long)> *this_02;
  MockSpec<void_(int_*,_unsigned_long)> *this_03;
  char *message;
  _func_int **pp_Var4;
  int i;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  AssertionResult gtest_ar_1;
  TestMemoryBuffer buffer;
  int mem [20];
  mock_allocator<int> alloc;
  Matcher<unsigned_long> local_1f0;
  AssertHelper local_1d8;
  Matcher<int_*> local_1d0;
  basic_memory_buffer<int,_10UL,_allocator_ref<mock_allocator<int>_>_> local_1b8;
  internal local_168 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160 [2];
  undefined4 local_14c;
  mock_allocator<int> local_118;
  
  mock_allocator<int>::mock_allocator(&local_118);
  local_1b8.super_basic_buffer<int>.capacity_ = (size_t)&DAT_0000000a;
  local_1b8.super_basic_buffer<int>._vptr_basic_buffer = (_func_int **)&PTR_grow_002a5ed0;
  local_1b8.super_basic_buffer<int>.size_ = 7;
  lVar3 = 2;
  auVar6 = _DAT_0023b010;
  auVar7 = _DAT_0023b020;
  do {
    iVar1 = (int)lVar3;
    if (SUB164(auVar7 ^ _DAT_0023b030,4) == -0x80000000 &&
        SUB164(auVar7 ^ _DAT_0023b030,0) < -0x7ffffff9) {
      local_1b8.store_[lVar3 + -2] = (iVar1 + -2) * (iVar1 + -2);
      local_1b8.store_[lVar3 + -1] = (iVar1 + -1) * (iVar1 + -1);
    }
    if (SUB164(auVar6 ^ _DAT_0023b030,4) == -0x80000000 &&
        SUB164(auVar6 ^ _DAT_0023b030,0) < -0x7ffffff9) {
      local_1b8.store_[lVar3] = iVar1 * iVar1;
      local_1b8.store_[lVar3 + 1] = (iVar1 + 1) * (iVar1 + 1);
    }
    lVar5 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 4;
    auVar7._8_8_ = lVar5 + 4;
    lVar5 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 4;
    auVar6._8_8_ = lVar5 + 4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 10);
  local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)CONCAT44(local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase._4_4_,10)
  ;
  local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase = (_func_int **)&DAT_0000000a;
  local_1b8.super_basic_buffer<int>.ptr_ = local_1b8.store_;
  local_1b8.super_allocator_ref<mock_allocator<int>_>.alloc_ = &local_118;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_168,"10u","buffer.capacity()",(uint *)&local_1f0,(unsigned_long *)&local_1d0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_160[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_160[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x16c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase != (_func_int **)0x0)) {
        (**(code **)(*local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase + 8))();
      }
      local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_14c = 0xdead;
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_1d0,0x14);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)&local_118,&local_118);
  this_01 = testing::internal::FunctionMocker<int_*(unsigned_long)>::With
                      (&local_118.gmock1_allocate_20,(Matcher<unsigned_long> *)&local_1d0);
  this_02 = testing::internal::MockSpec<int_*(unsigned_long)>::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                       ,0x16f,"alloc","allocate(20)");
  local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)operator_new(0x10);
  ((ActionInterface<int_*(unsigned_long)> *)
  local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002a8310;
  ((ActionInterface<int_*(unsigned_long)> *)
  local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase)[1]._vptr_ActionInterface =
       (_func_int **)local_168;
  local_1f0.super_MatcherBase<unsigned_long>.impl_.value_ =
       (MatcherInterface<unsigned_long> *)&local_1f0.super_MatcherBase<unsigned_long>.impl_;
  testing::internal::TypedExpectation<int_*(unsigned_long)>::WillOnce
            (this_02,(Action<int_*(unsigned_long)> *)&local_1f0);
  testing::internal::linked_ptr<testing::ActionInterface<int_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<int_*(unsigned_long)>_> *)&local_1f0);
  local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a62e0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *)
             &local_1d0.super_MatcherBase<int_*>.impl_);
  fmt::v5::basic_memory_buffer<int,_10UL,_allocator_ref<mock_allocator<int>_>_>::grow
            (&local_1b8,0x14);
  local_1d8.data_._0_4_ = 0x14;
  local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)local_1b8.super_basic_buffer<int>.capacity_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_1d0,"20u","buffer.capacity()",(uint *)&local_1d8,
             (unsigned_long *)&local_1f0);
  if (local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    if (local_1d0.super_MatcherBase<int_*>.impl_.value_ == (MatcherInterface<int_*> *)0x0) {
      pp_Var4 = (_func_int **)0x250739;
    }
    else {
      pp_Var4 = ((local_1d0.super_MatcherBase<int_*>.impl_.value_)->super_MatcherDescriberInterface)
                ._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x171,(char *)pp_Var4);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if ((ActionInterface<int_*(unsigned_long)> *)
        local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
        (ActionInterface<int_*(unsigned_long)> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((ActionInterface<int_*(unsigned_long)> *)
          local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
          (ActionInterface<int_*(unsigned_long)> *)0x0)) {
        (*(*(_func_int ***)local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase)[1])();
      }
      local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1d0.super_MatcherBase<int_*>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar3 = 0;
  lVar5 = 0;
  do {
    local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
         (_func_int **)
         CONCAT44(local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase._4_4_,
                  (int)lVar5 * (int)lVar5);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_1d0,"i * i","buffer[to_unsigned(i)]",(int *)&local_1f0,
               (int *)((long)local_1b8.super_basic_buffer<int>.ptr_ + lVar3));
    if (local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1f0);
      pp_Var4 = (_func_int **)0x250739;
      if (local_1d0.super_MatcherBase<int_*>.impl_.value_ != (MatcherInterface<int_*> *)0x0) {
        pp_Var4 = ((local_1d0.super_MatcherBase<int_*>.impl_.value_)->
                  super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                 ,0x174,(char *)pp_Var4);
      testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      if ((ActionInterface<int_*(unsigned_long)> *)
          local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
          (ActionInterface<int_*(unsigned_long)> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((ActionInterface<int_*(unsigned_long)> *)
            local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
            (ActionInterface<int_*(unsigned_long)> *)0x0)) {
          (*(*(_func_int ***)local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase)[1])();
        }
        local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0.super_MatcherBase<int_*>.impl_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 4;
  } while (lVar5 != 7);
  local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)
       CONCAT44(local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase._4_4_,0xdead);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_1d0,"0xdead","buffer[7]",(int *)&local_1f0,
             local_1b8.super_basic_buffer<int>.ptr_ + 7);
  if (local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    if (local_1d0.super_MatcherBase<int_*>.impl_.value_ == (MatcherInterface<int_*> *)0x0) {
      pp_Var4 = (_func_int **)0x250739;
    }
    else {
      pp_Var4 = ((local_1d0.super_MatcherBase<int_*>.impl_.value_)->super_MatcherDescriberInterface)
                ._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x176,(char *)pp_Var4);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if ((ActionInterface<int_*(unsigned_long)> *)
        local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
        (ActionInterface<int_*(unsigned_long)> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((ActionInterface<int_*(unsigned_long)> *)
          local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
          (ActionInterface<int_*(unsigned_long)> *)0x0)) {
        (*(*(_func_int ***)local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase)[1])();
      }
      local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1d0.super_MatcherBase<int_*>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::Matcher<int_*>::Matcher(&local_1d0,(int *)local_168);
  testing::Matcher<unsigned_long>::Matcher(&local_1f0,0x14);
  this_00 = &local_118.gmock2_deallocate_21;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&local_118);
  this_03 = testing::internal::FunctionMocker<void_(int_*,_unsigned_long)>::With
                      (this_00,&local_1d0,&local_1f0);
  testing::internal::MockSpec<void_(int_*,_unsigned_long)>::InternalExpectedAt
            (this_03,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x177,"alloc","deallocate(mem, 20)");
  local_1f0.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a62e0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&local_1f0.super_MatcherBase<unsigned_long>.impl_);
  local_1d0.super_MatcherBase<int_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a6310;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int_*>_>::~linked_ptr
            (&local_1d0.super_MatcherBase<int_*>.impl_);
  fmt::v5::basic_memory_buffer<int,_10UL,_allocator_ref<mock_allocator<int>_>_>::
  ~basic_memory_buffer(&local_1b8);
  testing::internal::FunctionMockerBase<void_(int_*,_unsigned_long)>::~FunctionMockerBase
            (&this_00->super_FunctionMockerBase<void_(int_*,_unsigned_long)>);
  testing::internal::FunctionMockerBase<int_*(unsigned_long)>::~FunctionMockerBase
            ((FunctionMockerBase<int_*(unsigned_long)> *)&local_118);
  return;
}

Assistant:

TEST(MemoryBufferTest, Grow) {
  typedef allocator_ref< mock_allocator<int> > Allocator;
  typedef basic_memory_buffer<int, 10, Allocator> Base;
  mock_allocator<int> alloc;
  struct TestMemoryBuffer : Base {
    TestMemoryBuffer(Allocator alloc) : Base(alloc) {}
    void grow(std::size_t size) { Base::grow(size); }
  } buffer((Allocator(&alloc)));
  buffer.resize(7);
  using fmt::internal::to_unsigned;
  for (int i = 0; i < 7; ++i)
    buffer[to_unsigned(i)] = i * i;
  EXPECT_EQ(10u, buffer.capacity());
  int mem[20];
  mem[7] = 0xdead;
  EXPECT_CALL(alloc, allocate(20)).WillOnce(Return(mem));
  buffer.grow(20);
  EXPECT_EQ(20u, buffer.capacity());
  // Check if size elements have been copied
  for (int i = 0; i < 7; ++i)
    EXPECT_EQ(i * i, buffer[to_unsigned(i)]);
  // and no more than that.
  EXPECT_EQ(0xdead, buffer[7]);
  EXPECT_CALL(alloc, deallocate(mem, 20));
}